

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O0

EventInfo * __thiscall
C3DFile::getEventInfo(EventInfo *__return_storage_ptr__,C3DFile *this,size_t index)

{
  size_t sVar1;
  char *pcVar2;
  float *pfVar3;
  undefined1 local_210 [8];
  DataMatrix<float> times_data;
  ParameterInfo times_info;
  ulong local_188;
  size_t j_1;
  string local_178 [8];
  string label;
  DataMatrix<char> labels_data;
  ParameterInfo labels_info;
  ulong local_d0;
  size_t j;
  string local_c0 [8];
  string context;
  DataMatrix<char> contexts_data;
  undefined1 local_78 [8];
  ParameterInfo contexts_info;
  uint local_20;
  size_t index_local;
  C3DFile *this_local;
  EventInfo *result;
  
  sVar1 = getEventCount(this);
  if (index < sVar1) {
    contexts_info._79_1_ = 0;
    EventInfo::EventInfo(__return_storage_ptr__);
    getParamInfo((ParameterInfo *)local_78,this,"EVENT:CONTEXTS");
    DataMatrix<char>::DataMatrix
              ((DataMatrix<char> *)((long)&context.field_2 + 8),
               (uint)*(byte *)(contexts_info._16_8_ + 1),(uint)*(byte *)contexts_info._16_8_);
    DataMatrix<char>::CopyFrom
              ((DataMatrix<char> *)((long)&context.field_2 + 8),(char *)contexts_info.dimensions);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_c0,"",(allocator<char> *)((long)&j + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&j + 7));
    local_d0 = 0;
    while( true ) {
      sVar1 = DataMatrix<char>::GetColumns((DataMatrix<char> *)((long)&context.field_2 + 8));
      local_20 = (uint)index;
      if (sVar1 <= local_d0) break;
      pcVar2 = DataMatrix<char>::operator()
                         ((DataMatrix<char> *)((long)&context.field_2 + 8),local_20,(uint)local_d0);
      std::__cxx11::string::operator+=(local_c0,*pcVar2);
      local_d0 = local_d0 + 1;
    }
    std::__cxx11::string::find_last_not_of((char)local_c0,0x20);
    std::__cxx11::string::substr((ulong)&labels_info.locked,(ulong)local_c0);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->context,(string *)&labels_info.locked);
    std::__cxx11::string::~string((string *)&labels_info.locked);
    getParamInfo((ParameterInfo *)&labels_data.columns,this,"EVENT:LABELS");
    DataMatrix<char>::DataMatrix
              ((DataMatrix<char> *)((long)&label.field_2 + 8),
               (uint)*(byte *)(labels_info._16_8_ + 1),(uint)*(byte *)labels_info._16_8_);
    DataMatrix<char>::CopyFrom
              ((DataMatrix<char> *)((long)&label.field_2 + 8),(char *)labels_info.dimensions);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_178,"",(allocator<char> *)((long)&j_1 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&j_1 + 7));
    local_188 = 0;
    while( true ) {
      sVar1 = DataMatrix<char>::GetColumns((DataMatrix<char> *)((long)&label.field_2 + 8));
      if (sVar1 <= local_188) break;
      pcVar2 = DataMatrix<char>::operator()
                         ((DataMatrix<char> *)((long)&label.field_2 + 8),local_20,(uint)local_188);
      std::__cxx11::string::operator+=(local_178,*pcVar2);
      local_188 = local_188 + 1;
    }
    std::__cxx11::string::find_last_not_of((char)local_178,0x20);
    std::__cxx11::string::substr((ulong)&times_info.locked,(ulong)local_178);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&times_info.locked);
    std::__cxx11::string::~string((string *)&times_info.locked);
    getParamInfo((ParameterInfo *)&times_data.columns,this,"EVENT:TIMES");
    DataMatrix<float>::DataMatrix
              ((DataMatrix<float> *)local_210,(uint)*(byte *)(times_info._16_8_ + 1),
               (uint)*(byte *)times_info._16_8_);
    DataMatrix<float>::CopyFrom((DataMatrix<float> *)local_210,(float *)times_info.int_data);
    pfVar3 = DataMatrix<float>::operator()((DataMatrix<float> *)local_210,local_20,0);
    __return_storage_ptr__->time_minutes = *pfVar3;
    pfVar3 = DataMatrix<float>::operator()((DataMatrix<float> *)local_210,local_20,1);
    __return_storage_ptr__->time_seconds = *pfVar3;
    contexts_info._79_1_ = 1;
    DataMatrix<float>::~DataMatrix((DataMatrix<float> *)local_210);
    ParameterInfo::~ParameterInfo((ParameterInfo *)&times_data.columns);
    std::__cxx11::string::~string(local_178);
    DataMatrix<char>::~DataMatrix((DataMatrix<char> *)((long)&label.field_2 + 8));
    ParameterInfo::~ParameterInfo((ParameterInfo *)&labels_data.columns);
    std::__cxx11::string::~string(local_c0);
    DataMatrix<char>::~DataMatrix((DataMatrix<char> *)((long)&context.field_2 + 8));
    ParameterInfo::~ParameterInfo((ParameterInfo *)local_78);
    if ((contexts_info._79_1_ & 1) == 0) {
      EventInfo::~EventInfo(__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("getEventCount() > index",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0x3d,"EventInfo C3DFile::getEventInfo(size_t)");
}

Assistant:

EventInfo C3DFile::getEventInfo (size_t index) {
	assert (getEventCount() > index);

	EventInfo result;

	ParameterInfo contexts_info = getParamInfo ("EVENT:CONTEXTS");
	DataMatrix<char> contexts_data (
			static_cast<unsigned int>(contexts_info.dimensions[1]),
			static_cast<unsigned int>(contexts_info.dimensions[0])
			);

	contexts_data.CopyFrom (contexts_info.char_data);
	string context = "";
	for (size_t j = 0; j < contexts_data.GetColumns(); j++) {
		context += contexts_data(index, j);
	}
	result.context = context.substr (0, context.find_last_not_of(' ') + 1);

	ParameterInfo labels_info = getParamInfo ("EVENT:LABELS");
	DataMatrix<char> labels_data (
			static_cast<unsigned int>(labels_info.dimensions[1]),
			static_cast<unsigned int>(labels_info.dimensions[0])
			);

	labels_data.CopyFrom (labels_info.char_data);
	string label = "";
	for (size_t j = 0; j < labels_data.GetColumns(); j++) {
		label += labels_data(index, j);
	}
	result.label = label.substr (0, label.find_last_not_of(' ') + 1);

	ParameterInfo times_info = getParamInfo ("EVENT:TIMES");
	DataMatrix<float> times_data (
			static_cast<unsigned int>(times_info.dimensions[1]),
			static_cast<unsigned int>(times_info.dimensions[0])
			);

	times_data.CopyFrom (times_info.float_data);
	result.time_minutes = times_data(index, 0);
	result.time_seconds = times_data(index, 1);

	return result;
}